

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.cpp
# Opt level: O2

int __thiscall ncnn::Net::load_param_bin(Net *this,DataReader *dr)

{
  vector<ncnn::Blob,_std::allocator<ncnn::Blob>_> *this_00;
  vector<int,_std::allocator<int>_> *this_01;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *pvVar1;
  int iVar2;
  pointer pBVar3;
  Net *pNVar4;
  int iVar5;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  ulong uVar6;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  Layer *pLVar7;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  long lVar8;
  int *piVar9;
  int j_1;
  char *pcVar10;
  int j;
  long lVar11;
  size_t sStack_a00;
  int top_count;
  int bottom_count;
  int local_9f0;
  int typeindex;
  int blob_count;
  int layer_count;
  Layer *local_9e0;
  Mat local_9d8;
  Net *local_998;
  int local_990;
  int magic;
  vector<int,_std::allocator<int>_> *local_988;
  vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> *local_980;
  ulong local_978;
  Mat shape_hints;
  ParamDict pd;
  
  magic = 0;
  local_998 = this;
  iVar5 = (*dr->_vptr_DataReader[3])(dr,&magic,4);
  if (CONCAT44(extraout_var,iVar5) == 4) {
    if (magic == 0x7685dd) {
      layer_count = 0;
      blob_count = 0;
      iVar5 = (*dr->_vptr_DataReader[3])(dr,&layer_count,4);
      if (CONCAT44(extraout_var_00,iVar5) == 4) {
        iVar5 = (*dr->_vptr_DataReader[3])(dr,&blob_count,4);
        pNVar4 = local_998;
        if (CONCAT44(extraout_var_01,iVar5) == 4) {
          if ((0 < (long)layer_count) && (0 < blob_count)) {
            local_980 = &local_998->layers;
            std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::resize
                      (local_980,(long)layer_count);
            this_00 = &pNVar4->blobs;
            std::vector<ncnn::Blob,_std::allocator<ncnn::Blob>_>::resize(this_00,(long)blob_count);
            ParamDict::ParamDict(&pd);
            uVar6 = 0;
            do {
              local_9f0 = (int)uVar6;
              iVar5 = layer_count;
              if (layer_count <= local_9f0) {
LAB_0011b250:
                ParamDict::~ParamDict(&pd);
                return -(uint)((int)uVar6 < iVar5);
              }
              local_990 = layer_count;
              local_978 = uVar6;
              iVar5 = (*dr->_vptr_DataReader[3])(dr,&typeindex,4);
              if (CONCAT44(extraout_var_02,iVar5) != 4) {
                pcVar10 = "read typeindex failed\n";
LAB_0011b32b:
                sStack_a00 = 0x16;
LAB_0011b23b:
                fwrite(pcVar10,sStack_a00,1,_stderr);
                uVar6 = local_978;
                iVar5 = local_990;
                goto LAB_0011b250;
              }
              iVar5 = (*dr->_vptr_DataReader[3])(dr,&bottom_count,4);
              if (CONCAT44(extraout_var_03,iVar5) != 4) {
                pcVar10 = "read bottom_count failed\n";
                sStack_a00 = 0x19;
                goto LAB_0011b23b;
              }
              iVar5 = (*dr->_vptr_DataReader[3])(dr,&top_count,4);
              if (CONCAT44(extraout_var_04,iVar5) != 4) {
                pcVar10 = "read top_count failed\n";
                goto LAB_0011b32b;
              }
              pLVar7 = create_layer(typeindex);
              if ((pLVar7 == (Layer *)0x0) &&
                 (pLVar7 = create_custom_layer(local_998,typeindex & 0xfffffeff),
                 pLVar7 == (Layer *)0x0)) {
                fprintf(_stderr,"layer %d not exists or registered\n",(ulong)(uint)typeindex);
                clear(local_998);
                uVar6 = local_978;
                iVar5 = local_990;
                goto LAB_0011b250;
              }
              local_988 = &pLVar7->bottoms;
              std::vector<int,_std::allocator<int>_>::resize(local_988,(long)bottom_count);
              local_9e0 = pLVar7;
              for (lVar8 = 0; lVar8 < bottom_count; lVar8 = lVar8 + 1) {
                iVar5 = (*dr->_vptr_DataReader[3])(dr,&shape_hints,4);
                if (CONCAT44(extraout_var_05,iVar5) != 4) {
                  pcVar10 = "read bottom_blob_index failed\n";
                  sStack_a00 = 0x1e;
                  goto LAB_0011b23b;
                }
                std::vector<int,_std::allocator<int>_>::push_back
                          (&(this_00->super__Vector_base<ncnn::Blob,_std::allocator<ncnn::Blob>_>).
                            _M_impl.super__Vector_impl_data._M_start[(int)shape_hints.data].
                            consumers,&local_9f0);
                (local_988->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                super__Vector_impl_data._M_start[lVar8] = (int)shape_hints.data;
              }
              this_01 = &local_9e0->tops;
              std::vector<int,_std::allocator<int>_>::resize(this_01,(long)top_count);
              for (lVar8 = 0; lVar8 < top_count; lVar8 = lVar8 + 1) {
                iVar5 = (*dr->_vptr_DataReader[3])(dr,&shape_hints,4);
                if (CONCAT44(extraout_var_06,iVar5) != 4) {
                  pcVar10 = "read top_blob_index failed\n";
                  sStack_a00 = 0x1b;
                  goto LAB_0011b23b;
                }
                (this_00->super__Vector_base<ncnn::Blob,_std::allocator<ncnn::Blob>_>)._M_impl.
                super__Vector_impl_data._M_start[(int)shape_hints.data].producer = local_9f0;
                (this_01->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                super__Vector_impl_data._M_start[lVar8] = (int)shape_hints.data;
              }
              iVar5 = ParamDict::load_param_bin(&pd,dr);
              if (iVar5 == 0) {
                local_9d8.elemsize._0_4_ = 0;
                local_9d8.elemsize._4_4_ = 0;
                local_9d8.elempack = 0;
                local_9d8.data = (void *)0x0;
                local_9d8.refcount._0_4_ = 0;
                local_9d8.refcount._4_4_ = 0;
                local_9d8.h = 0;
                local_9d8.c = 0;
                local_9d8.cstep = 0;
                local_9d8.allocator = (Allocator *)0x0;
                local_9d8.dims = 0;
                local_9d8.w = 0;
                ParamDict::get(&shape_hints,&pd,0x1e,&local_9d8);
                Mat::~Mat(&local_9d8);
                if ((CONCAT44(shape_hints.data._4_4_,(int)shape_hints.data) != 0) &&
                   ((long)shape_hints.c * shape_hints.cstep != 0)) {
                  piVar9 = (int *)(CONCAT44(shape_hints.data._4_4_,(int)shape_hints.data) + 8);
                  for (lVar8 = 0; lVar8 < top_count; lVar8 = lVar8 + 1) {
                    iVar5 = (this_01->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                            super__Vector_impl_data._M_start[lVar8];
                    pBVar3 = (this_00->super__Vector_base<ncnn::Blob,_std::allocator<ncnn::Blob>_>).
                             _M_impl.super__Vector_impl_data._M_start;
                    iVar2 = piVar9[-2];
                    if (iVar2 == 3) {
                      local_9d8.h = piVar9[0];
                      local_9d8.c = piVar9[1];
                      local_9d8.data = (void *)0x0;
                      local_9d8.refcount._0_4_ = 0;
                      local_9d8.refcount._4_4_ = 0;
                      local_9d8.elemsize._0_4_ = 4;
                      local_9d8.elemsize._4_4_ = 0;
                      local_9d8.elempack = 1;
                      local_9d8.allocator = (Allocator *)0x0;
                      local_9d8.w = piVar9[-1];
                      local_9d8.dims = 3;
                      local_9d8.cstep = (long)(local_9d8.h * piVar9[-1]) + 3U & 0x3ffffffffffffffc;
                      Mat::operator=(&pBVar3[iVar5].shape,&local_9d8);
LAB_0011b0d1:
                      Mat::~Mat(&local_9d8);
                    }
                    else {
                      if (iVar2 == 2) {
                        local_9d8.data = (void *)0x0;
                        local_9d8.refcount._0_4_ = 0;
                        local_9d8.refcount._4_4_ = 0;
                        local_9d8.elemsize._0_4_ = 4;
                        local_9d8.elemsize._4_4_ = 0;
                        local_9d8.elempack = 1;
                        local_9d8.allocator = (Allocator *)0x0;
                        local_9d8.w = piVar9[-1];
                        local_9d8.dims = 2;
                        local_9d8.c = 1;
                        local_9d8.h = *piVar9;
                        local_9d8.cstep = (size_t)(*piVar9 * piVar9[-1]);
                        Mat::operator=(&pBVar3[iVar5].shape,&local_9d8);
                        goto LAB_0011b0d1;
                      }
                      if (iVar2 == 1) {
                        local_9d8.cstep = (size_t)piVar9[-1];
                        local_9d8.data = (void *)0x0;
                        local_9d8.refcount._0_4_ = 0;
                        local_9d8.refcount._4_4_ = 0;
                        local_9d8.elemsize._0_4_ = 4;
                        local_9d8.elemsize._4_4_ = 0;
                        local_9d8.elempack = 1;
                        local_9d8.allocator = (Allocator *)0x0;
                        local_9d8.w = piVar9[-1];
                        local_9d8.dims = 1;
                        local_9d8.h = 1;
                        local_9d8.c = 1;
                        Mat::operator=(&pBVar3[iVar5].shape,&local_9d8);
                        goto LAB_0011b0d1;
                      }
                    }
                    piVar9 = piVar9 + 4;
                  }
                }
                pvVar1 = &local_9e0->bottom_shapes;
                std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::resize
                          (pvVar1,(long)bottom_count);
                lVar8 = 0;
                for (lVar11 = 0; lVar11 < bottom_count; lVar11 = lVar11 + 1) {
                  Mat::operator=((Mat *)((long)&((pvVar1->
                                                 super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>
                                                 )._M_impl.super__Vector_impl_data._M_start)->data +
                                        lVar8),
                                 &(this_00->
                                  super__Vector_base<ncnn::Blob,_std::allocator<ncnn::Blob>_>).
                                  _M_impl.super__Vector_impl_data._M_start
                                  [(local_988->super__Vector_base<int,_std::allocator<int>_>).
                                   _M_impl.super__Vector_impl_data._M_start[lVar11]].shape);
                  lVar8 = lVar8 + 0x40;
                }
                pvVar1 = &local_9e0->top_shapes;
                std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::resize(pvVar1,(long)top_count);
                lVar8 = 0;
                for (lVar11 = 0; pLVar7 = local_9e0, lVar11 < top_count; lVar11 = lVar11 + 1) {
                  Mat::operator=((Mat *)((long)&((pvVar1->
                                                 super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>
                                                 )._M_impl.super__Vector_impl_data._M_start)->data +
                                        lVar8),
                                 &(this_00->
                                  super__Vector_base<ncnn::Blob,_std::allocator<ncnn::Blob>_>).
                                  _M_impl.super__Vector_impl_data._M_start
                                  [(this_01->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                   super__Vector_impl_data._M_start[lVar11]].shape);
                  lVar8 = lVar8 + 0x40;
                }
                iVar5 = (*local_9e0->_vptr_Layer[2])(local_9e0,&pd);
                if (iVar5 == 0) {
                  (local_980->super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>).
                  _M_impl.super__Vector_impl_data._M_start[local_9f0] = pLVar7;
                }
                else {
                  fwrite("layer load_param failed\n",0x18,1,_stderr);
                }
                Mat::~Mat(&shape_hints);
              }
              else {
                fwrite("ParamDict load_param failed\n",0x1c,1,_stderr);
              }
              uVar6 = (ulong)(local_9f0 + 1);
            } while( true );
          }
          pcVar10 = "invalid layer_count or blob_count\n";
          sStack_a00 = 0x22;
        }
        else {
          pcVar10 = "read blob_count failed\n";
          sStack_a00 = 0x17;
        }
      }
      else {
        pcVar10 = "read layer_count failed\n";
        sStack_a00 = 0x18;
      }
    }
    else {
      pcVar10 = "param is too old, please regenerate\n";
      sStack_a00 = 0x24;
    }
  }
  else {
    pcVar10 = "read magic failed\n";
    sStack_a00 = 0x12;
  }
  fwrite(pcVar10,sStack_a00,1,_stderr);
  return -1;
}

Assistant:

int Net::load_param_bin(const DataReader& dr)
{
#define READ_VALUE(buf) \
    if (dr.read(&buf, sizeof(buf)) != sizeof(buf)) \
    { \
        fprintf(stderr, "read " #buf " failed\n"); \
        return -1; \
    }

    int magic = 0;
    READ_VALUE(magic)
    if (magic != 7767517)
    {
        fprintf(stderr, "param is too old, please regenerate\n");
        return -1;
    }

    int layer_count = 0;
    int blob_count = 0;
    READ_VALUE(layer_count)
    READ_VALUE(blob_count)
    if (layer_count <= 0 || blob_count <= 0)
    {
        fprintf(stderr, "invalid layer_count or blob_count\n");
        return -1;
    }

    layers.resize(layer_count);
    blobs.resize(blob_count);

#if NCNN_VULKAN
    if (opt.use_vulkan_compute)
    {
        if (!vkdev) vkdev = get_gpu_device();
        if (!vkdev) opt.use_vulkan_compute = false;// no vulkan device, fallback to cpu
    }
    if (opt.use_vulkan_compute)
    {
        // sanitize use options
        if (!vkdev->info.support_fp16_packed) opt.use_fp16_packed = false;
        if (!vkdev->info.support_fp16_storage) opt.use_fp16_storage = false;
        if (!vkdev->info.support_fp16_arithmetic) opt.use_fp16_arithmetic = false;
        if (!vkdev->info.support_int8_storage) opt.use_int8_storage = false;
        if (!vkdev->info.support_int8_arithmetic) opt.use_int8_arithmetic = false;
    }
#endif // NCNN_VULKAN

    ParamDict pd;

    for (int i=0; i<layer_count; i++)
    {
        int typeindex;
        int bottom_count;
        int top_count;
        READ_VALUE(typeindex)
        READ_VALUE(bottom_count)
        READ_VALUE(top_count)

        Layer* layer = create_layer(typeindex);
        if (!layer)
        {
            int custom_index = typeindex & ~LayerType::CustomBit;
            layer = create_custom_layer(custom_index);
        }
        if (!layer)
        {
            fprintf(stderr, "layer %d not exists or registered\n", typeindex);
            clear();
            return -1;
        }

#if NCNN_VULKAN
        if (opt.use_vulkan_compute)
            layer->vkdev = vkdev;
#endif // NCNN_VULKAN

//         layer->type = std::string(layer_type);
//         layer->name = std::string(layer_name);
//         fprintf(stderr, "new layer %d\n", typeindex);

        layer->bottoms.resize(bottom_count);
        for (int j=0; j<bottom_count; j++)
        {
            int bottom_blob_index;
            READ_VALUE(bottom_blob_index)

            Blob& blob = blobs[bottom_blob_index];

            blob.consumers.push_back(i);

            layer->bottoms[j] = bottom_blob_index;
        }

        layer->tops.resize(top_count);
        for (int j=0; j<top_count; j++)
        {
            int top_blob_index;
            READ_VALUE(top_blob_index)

            Blob& blob = blobs[top_blob_index];

//             blob.name = std::string(blob_name);
//             fprintf(stderr, "new blob %s\n", blob_name);

            blob.producer = i;

            layer->tops[j] = top_blob_index;
        }

        // layer specific params
        int pdlr = pd.load_param_bin(dr);
        if (pdlr != 0)
        {
            fprintf(stderr, "ParamDict load_param failed\n");
            continue;
        }

        // pull out top blob shape hints
        Mat shape_hints = pd.get(30, Mat());
        if (!shape_hints.empty())
        {
            const int* psh = shape_hints;
            for (int j=0; j<top_count; j++)
            {
                Blob& blob = blobs[layer->tops[j]];

                int dims = psh[0];
                if (dims == 1)
                {
                    blob.shape = Mat(psh[1], (void*)0, 4u, 1);
                }
                if (dims == 2)
                {
                    blob.shape = Mat(psh[1], psh[2], (void*)0, 4u, 1);
                }
                if (dims == 3)
                {
                    blob.shape = Mat(psh[1], psh[2], psh[3], (void*)0, 4u, 1);
                }

                psh += 4;
            }
        }

        // set bottom and top shape hints
        layer->bottom_shapes.resize(bottom_count);
        for (int j=0; j<bottom_count; j++)
        {
            layer->bottom_shapes[j] = blobs[layer->bottoms[j]].shape;
        }

        layer->top_shapes.resize(top_count);
        for (int j=0; j<top_count; j++)
        {
            layer->top_shapes[j] = blobs[layer->tops[j]].shape;
        }

        int lr = layer->load_param(pd);
        if (lr != 0)
        {
            fprintf(stderr, "layer load_param failed\n");
            continue;
        }

        layers[i] = layer;
    }

#undef READ_VALUE
    return 0;
}